

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  undefined1 *puVar1;
  curl_off_t *pcVar2;
  long lVar3;
  ulong uVar4;
  http_connect_state *phVar5;
  PureInfo *pPVar6;
  uint uVar7;
  _Bool _Var8;
  CURLcode CVar9;
  int iVar10;
  CURLcode CVar11;
  CHUNKcode CVar12;
  http_connect_state *phVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  timediff_t tVar17;
  char *pcVar18;
  size_t size;
  char *pcVar19;
  Curl_easy *pCVar20;
  char *pcVar21;
  char *pcVar22;
  long lVar23;
  bool bVar24;
  char byte;
  Curl_easy *local_b8;
  int *local_b0;
  int local_a4;
  curl_off_t *local_a0;
  int local_98;
  uint local_94;
  connectdata *local_90;
  http_connect_state *local_88;
  curl_socket_t local_80;
  int subversion;
  long local_78;
  ssize_t tookcareof;
  dynbuf req;
  CURLcode extra;
  
  local_a4 = sockindex;
  local_94 = remote_port;
  if (conn->connect_state == (http_connect_state *)0x0) {
    phVar13 = (http_connect_state *)(*Curl_ccalloc)(1,0x38);
    if (phVar13 == (http_connect_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(conn->data,"allocate connect buffer!\n");
    conn->connect_state = phVar13;
    Curl_dyn_init((dynbuf *)phVar13,0x4000);
    phVar13->tunnel_state = TUNNEL_INIT;
    phVar13->keepon = 1;
    phVar13->cl = 0;
    phVar13->field_0x34 = phVar13->field_0x34 & 0xfd;
  }
  subversion = 0;
  phVar13 = conn->connect_state;
  CVar11 = CURLE_OK;
  if ((phVar13 != (http_connect_state *)0x0) && (phVar13->tunnel_state != TUNNEL_COMPLETE)) {
    pCVar20 = conn->data;
    local_78 = (long)local_a4;
    local_80 = conn->sock[local_78];
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 & 0xef;
    pPVar6 = &pCVar20->info;
    local_b0 = &(pCVar20->req).httpcode;
    local_a0 = &phVar13->cl;
    local_b8 = pCVar20;
    local_90 = conn;
    local_88 = phVar13;
    CVar11 = CURLE_OK;
    do {
      uVar7 = local_94;
      if (phVar13->tunnel_state == TUNNEL_INIT) {
        bVar24 = false;
        Curl_infof(pCVar20,"Establish HTTP proxy tunnel to %s:%d\n",hostname,(ulong)local_94);
        (*Curl_cfree)((pCVar20->req).newurl);
        (pCVar20->req).newurl = (char *)0x0;
        pcVar18 = curl_maprintf("%s:%d",hostname,(ulong)uVar7);
        if (pcVar18 == (char *)0x0) {
          conn = local_90;
          CVar11 = CURLE_OUT_OF_MEMORY;
        }
        else {
          Curl_dyn_init(&req,0x20000);
          conn = local_90;
          CVar9 = Curl_http_output_auth(local_90,"CONNECT",pcVar18,true);
          (*Curl_cfree)(pcVar18);
          if (CVar9 == CURLE_OK) {
            pcVar18 = "1.1";
            if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
              pcVar18 = "1.0";
            }
            if ((conn->host).name == hostname) {
              bVar24 = (bool)(((conn->bits).field_0x5 & 0x10) >> 4);
            }
            else {
              pcVar14 = strchr(hostname,0x3a);
              bVar24 = pcVar14 != (char *)0x0;
            }
            pcVar19 = "";
            pcVar14 = "";
            if (bVar24 != false) {
              pcVar14 = "[";
              pcVar19 = "]";
            }
            pcVar14 = curl_maprintf("%s%s%s:%d",pcVar14,hostname,pcVar19,(ulong)local_94);
            if (pcVar14 == (char *)0x0) {
LAB_00128e4d:
              Curl_dyn_free(&req);
              CVar11 = CURLE_OUT_OF_MEMORY;
              bVar24 = false;
              CVar9 = CURLE_OK;
            }
            else {
              pcVar19 = Curl_checkProxyheaders(conn,"Host");
              if (pcVar19 == (char *)0x0) {
                pcVar19 = curl_maprintf("Host: %s\r\n");
                if (pcVar19 == (char *)0x0) {
                  (*Curl_cfree)(pcVar14);
                  goto LAB_00128e4d;
                }
              }
              else {
                pcVar19 = (char *)0x0;
              }
              pcVar15 = Curl_checkProxyheaders(conn,"Proxy-Connection");
              pcVar22 = "";
              if (pcVar15 == (char *)0x0) {
                pcVar22 = "Proxy-Connection: Keep-Alive\r\n";
              }
              pcVar16 = Curl_checkProxyheaders(conn,"User-Agent");
              pcVar15 = "";
              if ((pcVar16 == (char *)0x0) &&
                 (pcVar15 = "", (local_b8->set).str[0x26] != (char *)0x0)) {
                pcVar15 = (local_b8->state).aptr.uagent;
              }
              pcVar16 = pcVar19;
              if (pcVar19 == (char *)0x0) {
                pcVar16 = "";
              }
              pcVar21 = (local_b8->state).aptr.proxyuserpwd;
              if (pcVar21 == (char *)0x0) {
                pcVar21 = "";
              }
              CVar9 = Curl_dyn_addf(&req,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar14,pcVar18,pcVar16,
                                    pcVar21,pcVar15,pcVar22);
              if (pcVar19 != (char *)0x0) {
                (*Curl_cfree)(pcVar19);
              }
              (*Curl_cfree)(pcVar14);
              conn = local_90;
              if (CVar9 == CURLE_OK) {
                CVar9 = Curl_add_custom_headers(local_90,true,&req);
              }
              if (CVar9 == CURLE_OK) {
                CVar9 = Curl_dyn_add(&req,"\r\n");
              }
              if (CVar9 == CURLE_OK) {
                CVar9 = Curl_buffer_send(&req,conn,&pPVar6->request_size,0,local_a4);
              }
              bVar24 = true;
              if (CVar9 != CURLE_OK) {
                Curl_failf(local_b8,"Failed sending CONNECT to proxy");
              }
            }
            if (!bVar24) {
              bVar24 = false;
              goto LAB_00128e97;
            }
          }
          phVar13 = local_88;
          Curl_dyn_free(&req);
          if (CVar9 == CURLE_OK) {
            phVar13->tunnel_state = TUNNEL_CONNECT;
            bVar24 = true;
          }
          else {
            bVar24 = false;
            CVar11 = CVar9;
          }
        }
LAB_00128e97:
        iVar10 = 1;
        pCVar20 = local_b8;
        phVar13 = local_88;
        if (bVar24) goto LAB_00128eae;
      }
      else {
LAB_00128eae:
        tVar17 = Curl_timeleft(pCVar20,(curltime *)0x0,true);
        if (tVar17 < 1) {
          Curl_failf(pCVar20,"Proxy CONNECT aborted due to timeout");
          CVar11 = CURLE_OPERATION_TIMEDOUT;
          iVar10 = 1;
        }
        else {
          _Var8 = Curl_conn_data_pending(conn,local_a4);
          if (_Var8) {
            bVar24 = false;
            if (phVar13->keepon != 0) {
              local_98 = 0;
              do {
                CVar9 = Curl_read(conn,local_80,&byte,1,(ssize_t *)&req);
                lVar23 = 1;
                if ((CVar9 == CURLE_AGAIN) || (iVar10 = Curl_pgrsUpdate(conn), iVar10 != 0))
                goto LAB_00128f2c;
                if (CVar9 != CURLE_OK) {
                  phVar13->keepon = 0;
                  break;
                }
                if ((long)req.bufr < 1) {
                  if (((local_b8->set).proxyauth == 0) || ((local_b8->state).authproxy.avail == 0))
                  {
                    Curl_failf(local_b8,"Proxy CONNECT aborted");
                    local_98 = 1;
                    phVar13->keepon = 0;
                  }
                  else {
                    puVar1 = &(conn->bits).field_0x4;
                    *puVar1 = *puVar1 | 0x10;
                    Curl_infof(local_b8,"Proxy CONNECT connection closed\n");
                    phVar13->keepon = 0;
                  }
                  break;
                }
                if (phVar13->keepon < 2) {
                  CVar9 = Curl_dyn_addn(&phVar13->rcvbuf,&byte,1);
                  if (CVar9 == CURLE_OK) {
                    if (byte == '\n') {
                      pcVar18 = Curl_dyn_ptr(&phVar13->rcvbuf);
                      size = Curl_dyn_len(&phVar13->rcvbuf);
                      if (((local_b8->set).field_0x97b & 0x40) != 0) {
                        Curl_debug(local_b8,CURLINFO_HEADER_IN,pcVar18,size);
                      }
                      uVar4 = *(ulong *)&(local_b8->set).field_0x978;
                      if (((uVar4 >> 0x31 & 1) == 0) &&
                         (CVar9 = Curl_client_write(conn,(((uint)uVar4 >> 0x19 & 1) != 0) + 2,
                                                    pcVar18,size), CVar9 != CURLE_OK))
                      goto LAB_00128f2c;
                      pCVar20 = local_b8;
                      pcVar2 = &(local_b8->info).header_size;
                      *pcVar2 = *pcVar2 + size;
                      if ((*pcVar18 != '\r') && (*pcVar18 != '\n')) {
                        iVar10 = curl_strnequal("WWW-Authenticate:",pcVar18,0x11);
                        if (((iVar10 == 0) || (*local_b0 != 0x191)) &&
                           ((iVar10 = curl_strnequal("Proxy-authenticate:",pcVar18,0x13),
                            iVar10 == 0 || (*local_b0 != 0x197)))) {
                          iVar10 = curl_strnequal("Content-Length:",pcVar18,0xf);
                          if (iVar10 == 0) {
                            _Var8 = Curl_compareheader(pcVar18,"Connection:","close");
                            if (_Var8) {
LAB_00129366:
                              phVar13->field_0x34 = phVar13->field_0x34 | 2;
                            }
                            else {
                              iVar10 = curl_strnequal("Transfer-Encoding:",pcVar18,0x12);
                              if (iVar10 == 0) {
                                _Var8 = Curl_compareheader(pcVar18,"Proxy-Connection:","close");
                                if (_Var8) goto LAB_00129366;
                                iVar10 = __isoc99_sscanf(pcVar18,"HTTP/1.%d %d",&subversion,local_b0
                                                        );
                                if (iVar10 == 2) {
                                  (local_b8->info).httpproxycode = (local_b8->req).httpcode;
                                }
                              }
                              else {
                                if (*local_b0 - 200U < 100) {
                                  pcVar18 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
                                  goto LAB_001292db;
                                }
                                _Var8 = Curl_compareheader(pcVar18,"Transfer-Encoding:","chunked");
                                if (_Var8) {
                                  Curl_infof(local_b8,"CONNECT responded chunked\n");
                                  phVar13->field_0x34 = phVar13->field_0x34 | 1;
                                  Curl_httpchunk_init(conn);
                                }
                              }
                            }
                          }
                          else if (*local_b0 - 200U < 100) {
                            pcVar18 = "Ignoring Content-Length in CONNECT %03d response\n";
LAB_001292db:
                            Curl_infof(local_b8,pcVar18);
                          }
                          else {
                            curlx_strtoofft(pcVar18 + 0xf,(char **)0x0,10,local_a0);
                          }
                        }
                        else {
                          iVar10 = *local_b0;
                          pcVar18 = Curl_copy_header_value(pcVar18);
                          if (pcVar18 == (char *)0x0) {
                            bVar24 = false;
                          }
                          else {
                            CVar11 = Curl_http_input_auth(conn,iVar10 == 0x197,pcVar18);
                            (*Curl_cfree)(pcVar18);
                            bVar24 = CVar11 == CURLE_OK;
                          }
                          if (!bVar24) goto LAB_00128f2c;
                        }
                        Curl_dyn_reset(&phVar13->rcvbuf);
                        lVar23 = 0;
                        goto LAB_00128f2c;
                      }
                      if ((*local_b0 == 0x197) && (((local_b8->state).field_0x600 & 0x20) == 0)) {
                        phVar13->keepon = 2;
                        if (phVar13->cl == 0) {
                          if ((phVar13->field_0x34 & 1) == 0) goto LAB_00129303;
                          Curl_infof(local_b8,"Ignore chunked response-body\n");
                          puVar1 = &(pCVar20->req).field_0x560;
                          *puVar1 = *puVar1 | 8;
                          pcVar14 = pcVar18 + 1;
                          if (pcVar18[1] != '\n') {
                            pcVar14 = pcVar18;
                          }
                          CVar12 = Curl_httpchunk_read(conn,pcVar14 + 1,1,(ssize_t *)&req,
                                                       (CURLcode *)&tookcareof);
                          if (CVar12 == CHUNKE_STOP) {
                            Curl_infof(local_b8,"chunk reading DONE\n");
                            phVar13->keepon = 0;
                            phVar13->tunnel_state = TUNNEL_COMPLETE;
                          }
                        }
                        else {
                          Curl_infof(local_b8,"Ignore %ld bytes of response-body\n");
                        }
                      }
                      else {
LAB_00129303:
                        phVar13->keepon = 0;
                      }
                      if (*local_a0 == 0) {
                        phVar13->tunnel_state = TUNNEL_COMPLETE;
                        goto LAB_00128f3f;
                      }
                    }
                    lVar23 = 4;
LAB_00128f2c:
                    CVar11 = (*(code *)(&DAT_001573bc + *(int *)(&DAT_001573bc + lVar23 * 4)))();
                    return CVar11;
                  }
                  Curl_failf(local_b8,"CONNECT response too large!");
                  CVar9 = CURLE_RECV_ERROR;
                  goto LAB_00129548;
                }
                lVar3 = *local_a0;
                if (lVar3 != 0) {
                  *local_a0 = lVar3 + -1;
                  lVar23 = 4;
                  if (1 < lVar3) goto LAB_00128f2c;
                  phVar13->keepon = 0;
                  phVar13->tunnel_state = TUNNEL_COMPLETE;
                  break;
                }
                tookcareof = 0;
                CVar12 = Curl_httpchunk_read(conn,&byte,1,&tookcareof,&extra);
                if (CVar12 == CHUNKE_STOP) {
                  Curl_infof(local_b8,"chunk reading DONE\n");
                  phVar13->keepon = 0;
                  phVar13->tunnel_state = TUNNEL_COMPLETE;
                }
LAB_00128f3f:
              } while (phVar13->keepon != 0);
              bVar24 = local_98 != 0;
            }
            iVar10 = Curl_pgrsUpdate(conn);
            CVar9 = CURLE_RECV_ERROR;
            if (iVar10 != 0) {
              CVar9 = CURLE_ABORTED_BY_CALLBACK;
            }
            if ((bool)(iVar10 != 0 | bVar24)) {
LAB_00129548:
              iVar10 = 1;
            }
            else {
              if (99 < (local_b8->info).httpproxycode - 200U) {
                CVar9 = Curl_http_auth_act(conn);
                iVar10 = 1;
                if (CVar9 != CURLE_OK) goto LAB_001295bf;
                if (((conn->bits).field_0x4 & 0x20) != 0) {
                  phVar13->field_0x34 = phVar13->field_0x34 | 2;
                }
              }
              lVar23 = local_78;
              iVar10 = 0;
              CVar9 = CVar11;
              if (((phVar13->field_0x34 & 2) != 0) &&
                 (iVar10 = 0, (local_b8->req).newurl != (char *)0x0)) {
                Curl_closesocket(conn,conn->sock[local_78]);
                conn->sock[lVar23] = -1;
                iVar10 = 2;
              }
            }
LAB_001295bf:
            CVar11 = CVar9;
            pCVar20 = local_b8;
            if (iVar10 == 0) {
              iVar10 = 0;
              if (((local_b8->req).newurl != (char *)0x0) &&
                 (iVar10 = 0, phVar13->tunnel_state == TUNNEL_COMPLETE)) {
                phVar5 = conn->connect_state;
                Curl_dyn_reset(&phVar5->rcvbuf);
                phVar5->tunnel_state = TUNNEL_INIT;
                phVar5->keepon = 1;
                phVar5->cl = 0;
                phVar5->field_0x34 = phVar5->field_0x34 & 0xfd;
                pCVar20 = local_b8;
              }
            }
          }
          else {
            CVar11 = CURLE_OK;
            iVar10 = 1;
            pCVar20 = local_b8;
          }
        }
      }
      if (iVar10 != 0) {
        if (iVar10 != 2) goto LAB_0012978c;
        break;
      }
    } while ((pCVar20->req).newurl != (char *)0x0);
    if ((pCVar20->info).httpproxycode - 200U < 100) {
      phVar13->tunnel_state = TUNNEL_COMPLETE;
      (*Curl_cfree)((pCVar20->state).aptr.proxyuserpwd);
      (pCVar20->state).aptr.proxyuserpwd = (char *)0x0;
      (pCVar20->state).authproxy.field_0x18 = ((pCVar20->state).authproxy.field_0x18 & 0xfc) + 1;
      CVar11 = CURLE_OK;
      Curl_infof(pCVar20,"Proxy replied %d to CONNECT request\n",
                 (ulong)(uint)(pCVar20->info).httpproxycode);
      puVar1 = &(pCVar20->req).field_0x560;
      *puVar1 = *puVar1 & 0xf7;
      puVar1 = &(conn->bits).field_0x6;
      *puVar1 = *puVar1 & 0xfb;
      Curl_dyn_free(&phVar13->rcvbuf);
    }
    else {
      if (((phVar13->field_0x34 & 2) == 0) || ((pCVar20->req).newurl == (char *)0x0)) {
        (*Curl_cfree)((pCVar20->req).newurl);
        (pCVar20->req).newurl = (char *)0x0;
        Curl_conncontrol(conn,2);
        lVar23 = local_78;
        Curl_closesocket(conn,conn->sock[local_78]);
        conn->sock[lVar23] = -1;
      }
      else {
        puVar1 = &(conn->bits).field_0x4;
        *puVar1 = *puVar1 | 0x10;
        Curl_infof(pCVar20,"Connect me again please\n");
        phVar5 = conn->connect_state;
        phVar5->tunnel_state = TUNNEL_COMPLETE;
        Curl_dyn_free(&phVar5->rcvbuf);
        Curl_infof(conn->data,"CONNECT phase completed!\n");
      }
      phVar13->tunnel_state = TUNNEL_INIT;
      CVar11 = CURLE_OK;
      if (((conn->bits).field_0x4 & 0x10) == 0) {
        Curl_dyn_free(&phVar13->rcvbuf);
        Curl_failf(local_b8,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)(local_b8->req).httpcode);
        CVar11 = CURLE_RECV_ERROR;
      }
    }
  }
LAB_0012978c:
  if (((CVar11 != CURLE_OK) || (conn->connect_state == (http_connect_state *)0x0)) ||
     (conn->connect_state->tunnel_state == TUNNEL_COMPLETE)) {
    phVar13 = conn->connect_state;
    phVar13->tunnel_state = TUNNEL_COMPLETE;
    Curl_dyn_free(&phVar13->rcvbuf);
    Curl_infof(conn->data,"CONNECT phase completed!\n");
  }
  return CVar11;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(!conn->connect_state) {
    result = connect_init(conn, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    connect_done(conn);

  return result;
}